

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O1

sexp_conflict
sexp_arithmetic_shift
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict i,sexp_conflict count)

{
  char cVar1;
  sexp_conflict psVar2;
  long lVar3;
  ulong uVar4;
  ulong *puVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  sexp_conflict res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_50;
  sexp_gc_var_t local_48;
  
  local_50 = (sexp_conflict)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if (((ulong)count & 1) == 0) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,count);
    return psVar2;
  }
  if ((sexp_conflict)0x1 < count) {
    uVar8 = (long)count >> 1;
    bVar7 = (byte)uVar8;
    if (((ulong)i & 1) == 0) {
      if ((((ulong)i & 2) == 0) && (i->tag == 0xc)) {
        lVar3 = sexp_bignum_hi(i);
        if ((long)uVar8 < 0) {
          uVar8 = -uVar8;
          uVar4 = uVar8 >> 6;
          if (lVar3 < (long)uVar4) {
            local_50 = (sexp_conflict)((ulong)('\0' < (i->value).flonum_bits[0]) * 2 - 1);
          }
          else {
            local_50 = (sexp_conflict)sexp_make_bignum(ctx,(lVar3 - uVar4) + 1);
            if ((((ulong)local_50 & 3) != 0) || (local_50->tag != 0x13)) {
              (local_50->value).flonum_bits[0] = (i->value).flonum_bits[0];
              if (0 < (long)(lVar3 - uVar4)) {
                bVar7 = (byte)uVar8 & 0x3f;
                lVar6 = (lVar3 - uVar4) + 1;
                puVar5 = (ulong *)((long)&i->value + lVar3 * 8 + 8);
                lVar3 = 0;
                do {
                  *(ulong *)((long)&local_50->value + lVar6 * 8) = (*puVar5 >> bVar7) + lVar3;
                  if ((uVar8 & 0x3f) != 0) {
                    lVar3 = *puVar5 << (0x40 - bVar7 & 0x3f);
                  }
                  lVar6 = lVar6 + -1;
                  puVar5 = puVar5 + -1;
                } while (1 < lVar6);
              }
              if ((local_50->value).flonum_bits[0] < '\0') {
                local_50 = (sexp_conflict)sexp_bignum_fxadd(ctx,local_50,1);
              }
            }
          }
        }
        else {
          local_50 = (sexp_conflict)sexp_make_bignum(ctx);
          if ((((ulong)local_50 & 3) != 0) || (local_50->tag != 0x13)) {
            (local_50->value).flonum_bits[0] = (i->value).flonum_bits[0];
            if (lVar3 < 1) {
              uVar4 = 0;
            }
            else {
              lVar6 = 0;
              uVar4 = 0;
              do {
                *(ulong *)((long)&local_50->value + lVar6 * 8 + (uVar8 >> 6) * 8 + 0x10) =
                     (*(long *)((long)&i->value + lVar6 * 8 + 0x10) << (bVar7 & 0x3f)) + uVar4;
                if ((uVar8 & 0x3f) != 0) {
                  uVar4 = *(ulong *)((long)&i->value + lVar6 * 8 + 0x10) >>
                          (0x40 - (bVar7 & 0x3f) & 0x3f);
                }
                lVar6 = lVar6 + 1;
              } while (lVar3 != lVar6);
            }
            if ((uVar8 & 0x3f) != 0) {
              *(ulong *)((long)&local_50->value + (lVar3 + (uVar8 >> 6)) * 8 + 0x10) = uVar4;
            }
          }
        }
      }
      else {
        local_50 = (sexp_conflict)sexp_type_exception(ctx,self,2,i);
      }
    }
    else {
      uVar4 = (long)i >> 1;
      if ((long)uVar8 < 0) {
        local_50 = (sexp_conflict)0x1;
        if (0xffffffffffffffc0 < uVar8) {
          local_50 = (sexp_conflict)(((long)uVar4 >> (-bVar7 & 0x3f)) * 2 + 1);
        }
      }
      else {
        lVar3 = -1;
        do {
          if (lVar3 == 0x3f) {
            lVar3 = 0x40;
            break;
          }
          cVar1 = (char)lVar3;
          lVar3 = lVar3 + 1;
        } while (uVar4 >> (cVar1 + 2U & 0x3f) != 0);
        if ((long)(int)lVar3 + uVar8 + 1 < 0x3f) {
          local_50 = (sexp_conflict)
                     (((long)i >> 0x3e & 0xfffffffffffffffcU | 2) * (uVar4 << (bVar7 & 0x3f)) + 1);
        }
        else {
          local_48.var = &local_50;
          local_48.next = (ctx->value).context.saves;
          (ctx->value).context.saves = &local_48;
          local_50 = (sexp_conflict)sexp_fixnum_to_bignum(ctx,i);
          local_50 = sexp_arithmetic_shift(ctx,self,n,local_50,count);
          (ctx->value).context.saves = local_48.next;
        }
      }
    }
    i = (sexp_conflict)sexp_bignum_normalize(local_50);
  }
  return i;
}

Assistant:

sexp sexp_arithmetic_shift (sexp ctx, sexp self, sexp_sint_t n, sexp i, sexp count) {
  sexp_uint_t tmp;
  sexp_sint_t c;
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, offset, bit_shift, tail_shift, j;
  sexp_gc_var1(res);
#else
  sexp res;
#endif
  if (! sexp_fixnump(count))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, count);
  c = sexp_unbox_fixnum(count);
  if (c == 0) return i;
  if (sexp_fixnump(i)) {
    if (c < 0) {
      res = sexp_make_fixnum(c > -sizeof(sexp_sint_t)*CHAR_BIT ? sexp_unbox_fixnum(i) >> -c : 0);
    } else {
#if SEXP_USE_BIGNUMS
      if ((log2i(sexp_unbox_fixnum(i)) + c + 1)
          < (sizeof(sexp_uint_t)*CHAR_BIT - SEXP_FIXNUM_BITS)) {
#endif
        tmp = (sexp_uint_t)sexp_unbox_fixnum(i) << c;
        res = sexp_make_fixnum(tmp * sexp_fx_sign(i));
#if SEXP_USE_BIGNUMS
      } else {
        sexp_gc_preserve1(ctx, res);
        res = sexp_fixnum_to_bignum(ctx, i);
        res = sexp_arithmetic_shift(ctx, self, n, res, count);
        sexp_gc_release1(ctx);
      }
#endif
    }
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(i)) {
    len = sexp_bignum_hi(i);
    if (c < 0) {
      c = -c;
      offset = c / (sizeof(sexp_uint_t)*CHAR_BIT);
      bit_shift = c - offset*(sizeof(sexp_uint_t)*CHAR_BIT);
      if (len < offset) {
        res = sexp_make_fixnum(sexp_bignum_sign(i) > 0 ? 0 : -1);
      } else {
        res = sexp_make_bignum(ctx, len - offset + 1);
        if (!sexp_exceptionp(res)) {
          sexp_bignum_sign(res) = sexp_bignum_sign(i);
          for (j=len-offset-1, tmp=0; j>=0; j--) {
            sexp_bignum_data(res)[j]
              = (sexp_bignum_data(i)[j+offset] >> bit_shift)+ tmp;
            if (bit_shift != 0)
              tmp = sexp_bignum_data(i)[j+offset]
                << (sizeof(sexp_uint_t)*CHAR_BIT-bit_shift);
          }
          if (sexp_bignum_sign(res) < 0)
            res = sexp_bignum_fxadd(ctx, res, 1);
        }
      }
    } else {
      offset = c / (sizeof(sexp_uint_t)*CHAR_BIT);
      bit_shift = c - offset*(sizeof(sexp_uint_t)*CHAR_BIT);
      tail_shift = (sizeof(sexp_uint_t)*CHAR_BIT-bit_shift);
      res = sexp_make_bignum(ctx, len + offset + 1);
      if (!sexp_exceptionp(res)) {
        sexp_bignum_sign(res) = sexp_bignum_sign(i);
        for (j=tmp=0; j<len; j++) {
          sexp_bignum_data(res)[j+offset]
            = (sexp_bignum_data(i)[j] << bit_shift) + tmp;
          if (bit_shift != 0)
            tmp = sexp_bignum_data(i)[j] >> tail_shift;
        }
        if (bit_shift != 0) sexp_bignum_data(res)[len+offset] = tmp;
      }
    }
#endif
  } else {
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, i);
  }
  return sexp_bignum_normalize(res);
}